

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ExplicitImportSymbol::serializeTo(ExplicitImportSymbol *this,ASTSerializer *serializer)

{
  PackageSymbol *value;
  Symbol *value_00;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,0xc,"isFromExport",(ulong)this->isFromExport);
  value = package(this);
  if (value != (PackageSymbol *)0x0) {
    name._M_str = "package";
    name._M_len = 7;
    ASTSerializer::writeLink(serializer,name,&value->super_Symbol);
  }
  value_00 = importedSymbol(this);
  if (value_00 != (Symbol *)0x0) {
    name_00._M_str = "import";
    name_00._M_len = 6;
    ASTSerializer::writeLink(serializer,name_00,value_00);
    return;
  }
  return;
}

Assistant:

void ExplicitImportSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isFromExport", isFromExport);
    if (auto pkg = package())
        serializer.writeLink("package", *pkg);

    if (auto sym = importedSymbol())
        serializer.writeLink("import", *sym);
}